

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Texturing.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Texturing_TextureTransform(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  CX3DImporter_NodeElement_TextureTransform *pCVar6;
  allocator local_d1;
  string local_d0;
  undefined4 local_b0;
  allocator local_a9;
  undefined1 local_a8 [8];
  string an;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  aiVector2D translation;
  aiVector2D scale;
  float rotation;
  aiVector2D local_58;
  aiVector2D center;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&center);
  aiVector2t<float>::aiVector2t(&local_58,0.0,0.0);
  scale.x = 0.0;
  aiVector2t<float>::aiVector2t(&translation,1.0,1.0);
  aiVector2t<float>::aiVector2t((aiVector2t<float> *)&ne,0.0,0.0);
  _idx_end = (CX3DImporter_NodeElement_TextureTransform *)0x0;
  an.field_2._12_4_ = 0;
  pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  an.field_2._8_4_ =
       (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)an.field_2._12_4_ < (int)an.field_2._8_4_; an.field_2._12_4_ = an.field_2._12_4_ + 1)
  {
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar4,(ulong)(uint)an.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a8,(char *)CONCAT44(extraout_var,iVar2),&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,"DEF");
    if (bVar1) {
      pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar4,(ulong)(uint)an.field_2._12_4_);
      std::__cxx11::string::operator=((string *)&center,(char *)CONCAT44(extraout_var_00,iVar2));
      local_b0 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,"USE");
      if (bVar1) {
        pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar4,(ulong)(uint)an.field_2._12_4_);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar2))
        ;
        local_b0 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a8,"bboxCenter");
        if (bVar1) {
          local_b0 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a8,"bboxSize");
          if (bVar1) {
            local_b0 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a8,"containerField");
            if (bVar1) {
              local_b0 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a8,"center");
              if (bVar1) {
                XML_ReadNode_GetAttrVal_AsVec2f(this,an.field_2._12_4_,&local_58);
                local_b0 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a8,"rotation");
                if (bVar1) {
                  scale.x = XML_ReadNode_GetAttrVal_AsFloat(this,an.field_2._12_4_);
                  local_b0 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_a8,"scale");
                  if (bVar1) {
                    XML_ReadNode_GetAttrVal_AsVec2f(this,an.field_2._12_4_,&translation);
                    local_b0 = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_a8,"translation");
                    if (bVar1) {
                      XML_ReadNode_GetAttrVal_AsVec2f(this,an.field_2._12_4_,(aiVector2D *)&ne);
                      local_b0 = 4;
                    }
                    else {
                      Throw_IncorrectAttr(this,(string *)local_a8);
                      local_b0 = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_a8);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_TextureTransform,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    pCVar6 = (CX3DImporter_NodeElement_TextureTransform *)operator_new(0x70);
    CX3DImporter_NodeElement_TextureTransform::CX3DImporter_NodeElement_TextureTransform
              (pCVar6,this->NodeElement_Cur);
    _idx_end = pCVar6;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,(string *)&center);
    }
    _idx_end->Center = local_58;
    _idx_end->Rotation = scale.x;
    _idx_end->Scale = translation;
    _idx_end->Translation = (aiVector2D)ne;
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar6 = _idx_end;
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"TextureTransform",&local_d1);
      ParseNode_Metadata(this,&pCVar6->super_CX3DImporter_NodeElement,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::string::~string((string *)&center);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Texturing_TextureTransform()
{
    std::string use, def;
    aiVector2D center(0, 0);
    float rotation = 0;
    aiVector2D scale(1, 1);
    aiVector2D translation(0, 0);
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("center", center, XML_ReadNode_GetAttrVal_AsVec2f);
		MACRO_ATTRREAD_CHECK_RET("rotation", rotation, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("scale", scale, XML_ReadNode_GetAttrVal_AsVec2f);
		MACRO_ATTRREAD_CHECK_REF("translation", translation, XML_ReadNode_GetAttrVal_AsVec2f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TextureTransform, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_TextureTransform(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_TextureTransform*)ne)->Center = center;
		((CX3DImporter_NodeElement_TextureTransform*)ne)->Rotation = rotation;
		((CX3DImporter_NodeElement_TextureTransform*)ne)->Scale = scale;
		((CX3DImporter_NodeElement_TextureTransform*)ne)->Translation = translation;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "TextureTransform");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}